

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O3

double parse_timestamp(utf8_char_t *line)

{
  int iVar1;
  double dVar2;
  int ms;
  int ss;
  int mm;
  int hh;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  iVar1 = __isoc99_sscanf(line,"%d:%2d:%2d%*1[,.]%3d",&local_c,&local_10,&local_14,&local_18);
  if (iVar1 == 4) {
    dVar2 = (double)local_c * 3600.0;
  }
  else {
    iVar1 = __isoc99_sscanf(line,"%2d:%2d%*1[,.]%3d",&local_10,&local_14,&local_18);
    if (iVar1 != 3) {
      return -1.0;
    }
    dVar2 = 0.0;
  }
  return (double)local_18 / 1000.0 + (double)local_14 + dVar2 + (double)local_10 * 60.0;
}

Assistant:

double parse_timestamp(const utf8_char_t* line)
{
    int hh, mm, ss, ms;
    if (sscanf(line, "%d:%2d:%2d%*1[,.]%3d", &hh, &mm, &ss, &ms) == 4) {
        return VTTTIME2SECONDS(hh, mm, ss, ms);
    }
    if (sscanf(line, "%2d:%2d%*1[,.]%3d", &mm, &ss, &ms) == 3) {
        return VTTTIME2SECONDS(0.0, mm, ss, ms);
    }
    return -1.0;
}